

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-id.c++
# Opt level: O2

uint64_t __thiscall
capnp::compiler::generateChildId(compiler *this,uint64_t parentId,StringPtr childName)

{
  byte *pbVar1;
  long lVar2;
  ulong uVar3;
  ArrayPtr<const_unsigned_char> AVar4;
  StringPtr data;
  byte parentIdBytes [8];
  TypeIdGenerator local_b4;
  
  data.content.size_ = childName.content.ptr;
  pbVar1 = parentIdBytes;
  parentIdBytes[0] = '\0';
  parentIdBytes[1] = '\0';
  parentIdBytes[2] = '\0';
  parentIdBytes[3] = '\0';
  parentIdBytes[4] = '\0';
  parentIdBytes[5] = '\0';
  parentIdBytes[6] = '\0';
  parentIdBytes[7] = '\0';
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 8) {
    *pbVar1 = (byte)((ulong)this >> ((byte)lVar2 & 0x3f));
    pbVar1 = pbVar1 + 1;
  }
  local_b4.finished = false;
  local_b4.ctx.c = 0x98badcfe;
  local_b4.ctx.d = 0x10325476;
  local_b4.ctx.lo = 0;
  local_b4.ctx.hi = 0;
  local_b4.ctx.a = 0x67452301;
  local_b4.ctx.b = 0xefcdab89;
  AVar4.size_ = 8;
  AVar4.ptr = parentIdBytes;
  TypeIdGenerator::update(&local_b4,AVar4);
  data.content.ptr = (char *)parentId;
  TypeIdGenerator::update(&local_b4,data);
  AVar4 = TypeIdGenerator::finish(&local_b4);
  uVar3 = 0;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    uVar3 = uVar3 << 8 | (ulong)AVar4.ptr[lVar2];
  }
  return uVar3 | 0x8000000000000000;
}

Assistant:

uint64_t generateChildId(uint64_t parentId, kj::StringPtr childName) {
  // Compute ID by hashing the concatenation of the parent ID and the declaration name, and
  // then taking the first 8 bytes.

  kj::byte parentIdBytes[sizeof(uint64_t)]{};
  for (uint i = 0; i < sizeof(uint64_t); i++) {
    parentIdBytes[i] = (parentId >> (i * 8)) & 0xff;
  }

  TypeIdGenerator generator;
  generator.update(kj::arrayPtr(parentIdBytes, kj::size(parentIdBytes)));
  generator.update(childName);

  kj::ArrayPtr<const kj::byte> resultBytes = generator.finish();

  uint64_t result = 0;
  for (uint i = 0; i < sizeof(uint64_t); i++) {
    result = (result << 8) | resultBytes[i];
  }

  return result | (1ull << 63);
}